

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

void print_lines(char *buffer,size_t size,FILE *stream)

{
  void *pvVar1;
  char *pcVar2;
  size_t __n;
  
  pcVar2 = buffer + size;
  while( true ) {
    __n = (long)pcVar2 - (long)buffer;
    pvVar1 = memchr(buffer,10,__n);
    if (pvVar1 == (void *)0x0) break;
    fputs("# ",(FILE *)stream);
    fwrite(buffer,1,(long)((int)pvVar1 - (int)buffer),(FILE *)stream);
    fputs("\n",(FILE *)stream);
    fflush((FILE *)stream);
    buffer = (char *)((long)pvVar1 + 1);
  }
  if (buffer < pcVar2) {
    fputs("# ",(FILE *)stream);
    fwrite(buffer,1,(long)(int)__n,(FILE *)stream);
    fputs("\n",(FILE *)stream);
    fflush((FILE *)stream);
    return;
  }
  return;
}

Assistant:

void print_lines(const char* buffer, size_t size, FILE* stream) {
  const char* start;
  const char* end;

  start = buffer;
  while ((end = memchr(start, '\n', &buffer[size] - start))) {
    fputs("# ", stream);
    fwrite(start, 1, (int)(end - start), stream);
    fputs("\n", stream);
    fflush(stream);
    start = end + 1;
  }

  end = &buffer[size];
  if (start < end) {
    fputs("# ", stream);
    fwrite(start, 1, (int)(end - start), stream);
    fputs("\n", stream);
    fflush(stream);
  }
}